

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

RPCHelpMan * stop(void)

{
  initializer_list<RPCArg> __l;
  int iVar1;
  RPCHelpMan *in_RDI;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffffb18;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffffb20;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffffb28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  allocator_type *in_stack_fffffffffffffb50;
  allocator<char> *in_stack_fffffffffffffb58;
  iterator in_stack_fffffffffffffb60;
  undefined1 *puVar3;
  RPCArgOptions *in_stack_fffffffffffffb68;
  string *in_stack_fffffffffffffb70;
  Fallback *in_stack_fffffffffffffb78;
  undefined1 skip_type_check;
  undefined8 in_stack_fffffffffffffb80;
  Type type;
  vector<RPCResult,_std::allocator<RPCResult>_> *inner;
  string *in_stack_fffffffffffffb88;
  string *description;
  RPCArg *in_stack_fffffffffffffb90;
  RPCResult *result;
  RPCResults *this_00;
  RPCResult *this_01;
  allocator<char> local_3c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3c8;
  allocator<char> local_3a9 [9];
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffc7c;
  undefined8 in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  allocator<char> local_363;
  allocator<char> local_362;
  allocator<char> local_361 [225];
  RPCMethodImpl *in_stack_fffffffffffffd80;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  type = (Type)((ulong)in_stack_fffffffffffffb80 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (stop()::RESULT_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&stop()::RESULT_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,
                 in_stack_fffffffffffffb58);
      std::allocator<char>::~allocator(local_361);
      __cxa_atexit(std::__cxx11::string::~string,&stop()::RESULT_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&stop()::RESULT_abi_cxx11_);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  this_01 = (RPCResult *)&stack0xfffffffffffffc7f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  uVar4 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffffb28,(Optional *)in_stack_fffffffffffffb20);
  this_00 = (RPCResults *)&stack0xfffffffffffffc77;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  std::__cxx11::string::string(in_stack_fffffffffffffb30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffb18);
  RPCArg::RPCArg(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,type,in_stack_fffffffffffffb78,
                 in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffffb78 >> 0x38);
  result = (RPCResult *)&stack0xfffffffffffffc76;
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffffb18);
  __l._M_len = (size_type)in_stack_fffffffffffffb68;
  __l._M_array = in_stack_fffffffffffffb60;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffb58,__l,
             in_stack_fffffffffffffb50);
  description = (string *)local_3a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  std::operator+(&in_stack_fffffffffffffb68->skip_type_check,&in_stack_fffffffffffffb60->m_names);
  std::operator+(in_stack_fffffffffffffb30,(char *)in_stack_fffffffffffffb28);
  local_3c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inner = &local_3c8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffb18);
  RPCResult::RPCResult
            (this_01,(Type)((ulong)this_00 >> 0x20),(string *)result,description,inner,
             (bool)skip_type_check);
  RPCResults::RPCResults(this_00,result);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffffb18,(string *)0x716567);
  this = (RPCArg *)&stack0xfffffffffffffc10;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::function<stop()::__0,void>
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffffc88,(string *)in_stack_fffffffffffffc80,
             (string *)CONCAT44(in_stack_fffffffffffffc7c,uVar4),
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffc70,
             (RPCResults *)in_stack_fffffffffffffc68,(RPCExamples *)in_stack_fffffffffffffc60,
             in_stack_fffffffffffffd80);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_3c9);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffffb28);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_3a9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffffb28);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar3 = local_150;
  puVar2 = local_48;
  do {
    puVar2 = puVar2 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar2 != puVar3);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc77);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc7f);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_363);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_362);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan stop()
{
    static const std::string RESULT{PACKAGE_NAME " stopping"};
    return RPCHelpMan{"stop",
    // Also accept the hidden 'wait' integer argument (milliseconds)
    // For instance, 'stop 1000' makes the call wait 1 second before returning
    // to the client (intended for testing)
                "\nRequest a graceful shutdown of " PACKAGE_NAME ".",
                {
                    {"wait", RPCArg::Type::NUM, RPCArg::Optional::OMITTED, "how long to wait in ms", RPCArgOptions{.hidden=true}},
                },
                RPCResult{RPCResult::Type::STR, "", "A string with the content '" + RESULT + "'"},
                RPCExamples{""},
        [&](const RPCHelpMan& self, const JSONRPCRequest& jsonRequest) -> UniValue
{
    // Event loop will exit after current HTTP requests have been handled, so
    // this reply will get back to the client.
    CHECK_NONFATAL((*CHECK_NONFATAL(EnsureAnyNodeContext(jsonRequest.context).shutdown))());
    if (jsonRequest.params[0].isNum()) {
        UninterruptibleSleep(std::chrono::milliseconds{jsonRequest.params[0].getInt<int>()});
    }
    return RESULT;
},
    };
}